

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesH9
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,H9 *hasher,int *dist_cache,size_t *last_insert_len,
               Command *commands,size_t *num_commands,size_t *num_literals)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  Command *pCVar4;
  uint32_t uVar5;
  int iVar6;
  uint uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  long lVar10;
  ulong uVar11;
  uint8_t *puVar12;
  ulong uVar13;
  uint8_t *puVar14;
  ulong uVar15;
  int *piVar16;
  DictionarySearchStatictics *pDVar17;
  uint8_t *local_b10;
  uint8_t *local_b00;
  uint8_t *local_af0;
  uint8_t *local_ac0;
  uint local_ab4;
  uint8_t *local_ab0;
  ulong local_aa8;
  ulong local_aa0;
  uint local_a94;
  uint8_t *local_a90;
  uint8_t *local_a88;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t distance_code;
  HasherSearchResult sr2;
  int is_match_found_2;
  size_t cost_diff_lazy;
  size_t sStack_a20;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t max_backward_limit;
  H9 *hasher_local;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_8d8;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket_2;
  size_t dist_2;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_7e2;
  uint32_t nbits_2;
  ushort local_7ba;
  uint16_t bits64;
  ushort local_79a;
  size_t score_4;
  size_t len_4;
  size_t backward_4;
  size_t prev_ix_3;
  size_t down_1;
  uint32_t *bucket_1;
  uint32_t key_2;
  size_t score_3;
  size_t len_3;
  size_t prev_ix_2;
  size_t backward_3;
  size_t idx_1;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  int is_match_found_3;
  size_t cur_ix_masked_1;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_6a8;
  size_t local_698;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_668;
  size_t local_658;
  size_t item_1;
  ulong uStack_620;
  int is_match_found_4;
  size_t i_3;
  size_t key_3;
  uint64_t t_16;
  uint64_t t_15;
  uint64_t t_14;
  uint64_t t_13;
  uint64_t t_20;
  uint64_t t_19;
  uint64_t t_18;
  uint64_t t_17;
  uint32_t h_1;
  size_t transform_id_1;
  size_t score_5;
  size_t backward_5;
  size_t matchlen_1;
  size_t offset_1;
  size_t dist_1;
  size_t len_5;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_4b0;
  size_t local_4a0;
  uint64_t t_25;
  uint64_t t_24;
  uint64_t t_23;
  uint64_t t_22;
  uint32_t t_21;
  size_t score_1;
  size_t len_1;
  size_t backward_1;
  size_t prev_ix_1;
  size_t down;
  uint32_t *bucket;
  uint32_t key;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t idx;
  size_t i;
  size_t best_len;
  size_t best_score;
  int is_match_found;
  size_t cur_ix_masked;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_340;
  size_t local_330;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_300;
  size_t local_2f0;
  size_t item;
  ulong uStack_2b8;
  int is_match_found_1;
  size_t i_1;
  size_t key_1;
  uint64_t t_3;
  uint64_t t_2;
  uint64_t t_1;
  uint64_t t;
  uint64_t t_7;
  uint64_t t_6;
  uint64_t t_5;
  uint64_t t_4;
  uint32_t h;
  size_t transform_id;
  size_t score_2;
  size_t backward_2;
  size_t matchlen;
  size_t offset;
  size_t dist;
  size_t len_2;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_148;
  size_t local_138;
  uint64_t t_12;
  uint64_t t_11;
  uint64_t t_10;
  uint64_t t_9;
  uint32_t t_8;
  uint8_t *local_c8;
  size_t i_4;
  size_t minor_ix;
  uint32_t key_4;
  size_t minor_ix_2;
  uint32_t key_6;
  size_t minor_ix_1;
  uint32_t key_5;
  
  pCVar4 = commands;
  puVar8 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  pos_end = *last_insert_len;
  puVar9 = (uint8_t *)(position + num_bytes);
  local_a88 = (uint8_t *)position;
  if (3 < num_bytes) {
    local_a88 = (uint8_t *)((position + num_bytes) - 3);
  }
  iVar6 = 0x200;
  if (params->quality < 9) {
    iVar6 = 0x40;
  }
  lVar10 = (long)iVar6;
  kMinScore = position + lVar10;
  puVar12 = (uint8_t *)position;
LAB_00115e6c:
  do {
    ringbuffer_local = puVar12;
    if (puVar9 <= ringbuffer_local + 4) {
      *last_insert_len = (size_t)(puVar9 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar4 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar9 - (long)ringbuffer_local;
    local_a90 = puVar8;
    if (ringbuffer_local < puVar8) {
      local_a90 = ringbuffer_local;
    }
    sr.len_x_code = 0;
    sr.distance = 0x1f90;
    uVar11 = (ulong)ringbuffer_local & ringbuffer_mask;
    bVar2 = false;
    best_len = 0x1f90;
    i = 0;
    sStack_a20 = 0;
    sr.len = 0;
    for (idx = 0; idx < 0x10; idx = idx + 1) {
      puVar12 = (uint8_t *)(long)(dist_cache[kDistanceCacheIndex[idx]] + kDistanceCacheOffset[idx]);
      if ((((ringbuffer_local + -(long)puVar12 < ringbuffer_local) && (puVar12 <= local_a90)) &&
          (uVar13 = ringbuffer_mask & (ulong)(ringbuffer_local + -(long)puVar12),
          uVar11 + i <= ringbuffer_mask)) &&
         ((uVar13 + i <= ringbuffer_mask && (ringbuffer[uVar11 + i] == ringbuffer[uVar13 + i])))) {
        local_300 = (ulong *)(ringbuffer + uVar11);
        limit2 = 0;
        x = (max_distance >> 3) + 1;
LAB_00116162:
        x = x - 1;
        if (x != 0) {
          if (*local_300 == *(ulong *)(ringbuffer + limit2 + uVar13)) goto LAB_001161e0;
          iVar6 = 0;
          for (uVar13 = *local_300 ^ *(ulong *)(ringbuffer + limit2 + uVar13); (uVar13 & 1) == 0;
              uVar13 = uVar13 >> 1 | 0x8000000000000000) {
            iVar6 = iVar6 + 1;
          }
          local_2f0 = ((ulong)(long)iVar6 >> 3) + limit2;
          goto LAB_0011633d;
        }
        matched = (max_distance & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (ringbuffer[limit2 + uVar13] != (uint8_t)*local_300) {
            local_2f0 = limit2;
            goto LAB_0011633d;
          }
          local_300 = (ulong *)((long)local_300 + 1);
          limit2 = limit2 + 1;
        }
        local_2f0 = limit2;
LAB_0011633d:
        if (((2 < local_2f0) || ((local_2f0 == 2 && (idx < 2)))) &&
           (uVar13 = local_2f0 * 0x21c + kDistanceShortCodeCost[idx], best_len < uVar13)) {
          i = local_2f0;
          sStack_a20 = local_2f0;
          bVar2 = true;
          sr.len_x_code = (size_t)puVar12;
          sr.distance = uVar13;
          best_len = uVar13;
        }
      }
    }
    uVar5 = HashBytesH9(ringbuffer + uVar11);
    if (hasher->num_[uVar5] < 0x101) {
      local_a94 = 0;
    }
    else {
      local_a94 = hasher->num_[uVar5] - 0x100;
    }
    idx = (size_t)hasher->num_[uVar5];
    while (local_a94 < idx) {
      idx = idx - 1;
      puVar12 = ringbuffer_local + -(ulong)hasher->buckets_[(ulong)(uVar5 << 8) + (idx & 0xff)];
      if (local_a90 < puVar12) break;
      uVar13 = ringbuffer_mask & hasher->buckets_[(ulong)(uVar5 << 8) + (idx & 0xff)];
      if (((uVar11 + i <= ringbuffer_mask) && (uVar13 + i <= ringbuffer_mask)) &&
         (ringbuffer[uVar11 + i] == ringbuffer[uVar13 + i])) {
        local_340 = (ulong *)(ringbuffer + uVar11);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_00116623:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_340 == *(ulong *)(ringbuffer + limit2_1 + uVar13)) goto LAB_001166a1;
          iVar6 = 0;
          for (uVar13 = *local_340 ^ *(ulong *)(ringbuffer + limit2_1 + uVar13); (uVar13 & 1) == 0;
              uVar13 = uVar13 >> 1 | 0x8000000000000000) {
            iVar6 = iVar6 + 1;
          }
          local_330 = ((ulong)(long)iVar6 >> 3) + limit2_1;
          goto LAB_001167fe;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar13] != (uint8_t)*local_340) {
            local_330 = limit2_1;
            goto LAB_001167fe;
          }
          local_340 = (ulong *)((long)local_340 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_330 = limit2_1;
LAB_001167fe:
        if (3 < local_330) {
          iVar6 = 0x1f;
          if ((uint)puVar12 != 0) {
            for (; (uint)puVar12 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          uVar13 = (local_330 * 0x21c + 0x1e00) - (ulong)(uint)(iVar6 * 0x78);
          if (best_len < uVar13) {
            i = local_330;
            sStack_a20 = local_330;
            bVar2 = true;
            sr.len_x_code = (size_t)puVar12;
            sr.distance = uVar13;
            best_len = uVar13;
          }
        }
      }
    }
    hasher->buckets_[(ulong)(uVar5 << 8) + (long)(int)(hasher->num_[uVar5] & 0xff)] =
         (uint32_t)ringbuffer_local;
    hasher->num_[uVar5] = hasher->num_[uVar5] + 1;
    if (!bVar2) {
      pDVar17 = &hasher->dict_search_stats_;
      piVar16 = (int *)(ringbuffer + uVar11);
      bVar2 = false;
      if ((hasher->dict_search_stats_).num_matches < pDVar17->num_lookups >> 7) {
        bVar2 = false;
      }
      else {
        i_1 = (size_t)(((uint)(*piVar16 * 0x1e35a7bd) >> 0x12) << 1);
        for (uStack_2b8 = 0; uStack_2b8 < 2; uStack_2b8 = uStack_2b8 + 1) {
          uVar1 = kStaticDictionaryHash[i_1];
          uVar11 = (ulong)uVar1;
          pDVar17->num_lookups = pDVar17->num_lookups + 1;
          if (uVar11 != 0) {
            uVar13 = uVar11 & 0x1f;
            uVar15 = (ulong)(uVar1 >> 5);
            if (max_distance < uVar13) {
              bVar3 = false;
            }
            else {
              local_148 = (ulong *)(&kBrotliDictionary +
                                   (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength + uVar13 * 4)
                                   + uVar13 * uVar15);
              limit2_2 = 0;
              x_2 = (uVar13 >> 3) + 1;
LAB_00116b8d:
              x_2 = x_2 - 1;
              if (x_2 != 0) {
                if (*local_148 == *(ulong *)((long)piVar16 + limit2_2)) goto LAB_00116c0b;
                iVar6 = 0;
                for (uVar11 = *local_148 ^ *(ulong *)((long)piVar16 + limit2_2); (uVar11 & 1) == 0;
                    uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                  iVar6 = iVar6 + 1;
                }
                local_138 = ((ulong)(long)iVar6 >> 3) + limit2_2;
                goto LAB_00116d68;
              }
              matched_2 = (uVar11 & 7) + 1;
              while (matched_2 = matched_2 - 1, matched_2 != 0) {
                if (*(char *)((long)piVar16 + limit2_2) != (char)*local_148) {
                  local_138 = limit2_2;
                  goto LAB_00116d68;
                }
                local_148 = (ulong *)((long)local_148 + 1);
                limit2_2 = limit2_2 + 1;
              }
              local_138 = limit2_2;
LAB_00116d68:
              if ((uVar13 < local_138 + 10) && (local_138 != 0)) {
                iVar6 = 0x1f;
                uVar7 = (uint)(local_a90 +
                              ((ulong)""[uVar13 - local_138] <<
                              ((&kBrotliDictionarySizeBitsByLength)[uVar13] & 0x3f)) + uVar15 + 1);
                if (uVar7 != 0) {
                  for (; uVar7 >> iVar6 == 0; iVar6 = iVar6 + -1) {
                  }
                }
                uVar11 = (local_138 * 0x21c + 0x1e00) - (ulong)(uint)(iVar6 * 0x78);
                if (uVar11 < sr.distance) {
                  bVar3 = false;
                }
                else {
                  sStack_a20 = local_138;
                  sr.len = uVar13 ^ local_138;
                  bVar3 = true;
                  sr.len_x_code =
                       (size_t)(local_a90 +
                               ((ulong)""[uVar13 - local_138] <<
                               ((&kBrotliDictionarySizeBitsByLength)[uVar13] & 0x3f)) + uVar15 + 1);
                  sr.distance = uVar11;
                }
              }
              else {
                bVar3 = false;
              }
            }
            if (bVar3) {
              (hasher->dict_search_stats_).num_matches =
                   (hasher->dict_search_stats_).num_matches + 1;
              bVar2 = true;
            }
          }
          i_1 = i_1 + 1;
        }
      }
    }
    if (bVar2) {
      cost_diff_lazy._4_4_ = 0;
      do {
        max_distance = max_distance - 1;
        if (params->quality < 5) {
          local_aa0 = sStack_a20 - 1;
          if (max_distance <= local_aa0) {
            local_aa0 = max_distance;
          }
          local_aa8 = local_aa0;
        }
        else {
          local_aa8 = 0;
        }
        sr2.len_x_code = 0;
        sr2.distance = 0x1f90;
        local_ab0 = puVar8;
        if (ringbuffer_local + 1 < puVar8) {
          local_ab0 = ringbuffer_local + 1;
        }
        puVar12 = ringbuffer_local + 1;
        uVar11 = (ulong)puVar12 & ringbuffer_mask;
        bVar2 = false;
        best_len_1 = 0x1f90;
        i_2 = local_aa8;
        distance_code = 0;
        sr2.len = 0;
        for (idx_1 = 0; idx_1 < 0x10; idx_1 = idx_1 + 1) {
          puVar14 = (uint8_t *)
                    (long)(dist_cache[kDistanceCacheIndex[idx_1]] + kDistanceCacheOffset[idx_1]);
          if (((puVar12 + -(long)puVar14 < puVar12) && (puVar14 <= local_ab0)) &&
             ((uVar13 = ringbuffer_mask & (ulong)(puVar12 + -(long)puVar14),
              uVar11 + i_2 <= ringbuffer_mask &&
              ((uVar13 + i_2 <= ringbuffer_mask &&
               (ringbuffer[uVar11 + i_2] == ringbuffer[uVar13 + i_2])))))) {
            local_668 = (ulong *)(ringbuffer + uVar11);
            limit2_3 = 0;
            x_3 = (max_distance >> 3) + 1;
LAB_001172b7:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              if (*local_668 == *(ulong *)(ringbuffer + limit2_3 + uVar13)) goto LAB_00117335;
              iVar6 = 0;
              for (uVar13 = *local_668 ^ *(ulong *)(ringbuffer + limit2_3 + uVar13);
                  (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                iVar6 = iVar6 + 1;
              }
              local_658 = ((ulong)(long)iVar6 >> 3) + limit2_3;
              goto LAB_00117492;
            }
            matched_3 = (max_distance & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (ringbuffer[limit2_3 + uVar13] != (uint8_t)*local_668) {
                local_658 = limit2_3;
                goto LAB_00117492;
              }
              local_668 = (ulong *)((long)local_668 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_658 = limit2_3;
LAB_00117492:
            if (((2 < local_658) || ((local_658 == 2 && (idx_1 < 2)))) &&
               (uVar13 = local_658 * 0x21c + kDistanceShortCodeCost[idx_1], best_len_1 < uVar13)) {
              i_2 = local_658;
              distance_code = local_658;
              bVar2 = true;
              sr2.len_x_code = (size_t)puVar14;
              sr2.distance = uVar13;
              best_len_1 = uVar13;
            }
          }
        }
        uVar5 = HashBytesH9(ringbuffer + uVar11);
        if (hasher->num_[uVar5] < 0x101) {
          local_ab4 = 0;
        }
        else {
          local_ab4 = hasher->num_[uVar5] - 0x100;
        }
        idx_1 = (size_t)hasher->num_[uVar5];
        while (local_ab4 < idx_1) {
          idx_1 = idx_1 - 1;
          puVar14 = puVar12 + -(ulong)hasher->buckets_[(ulong)(uVar5 << 8) + (idx_1 & 0xff)];
          if (local_ab0 < puVar14) break;
          uVar13 = ringbuffer_mask & hasher->buckets_[(ulong)(uVar5 << 8) + (idx_1 & 0xff)];
          if (((uVar11 + i_2 <= ringbuffer_mask) && (uVar13 + i_2 <= ringbuffer_mask)) &&
             (ringbuffer[uVar11 + i_2] == ringbuffer[uVar13 + i_2])) {
            local_6a8 = (ulong *)(ringbuffer + uVar11);
            limit2_4 = 0;
            x_4 = (max_distance >> 3) + 1;
LAB_00117778:
            x_4 = x_4 - 1;
            if (x_4 != 0) {
              if (*local_6a8 == *(ulong *)(ringbuffer + limit2_4 + uVar13)) goto LAB_001177f6;
              iVar6 = 0;
              for (uVar13 = *local_6a8 ^ *(ulong *)(ringbuffer + limit2_4 + uVar13);
                  (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                iVar6 = iVar6 + 1;
              }
              local_698 = ((ulong)(long)iVar6 >> 3) + limit2_4;
              goto LAB_00117953;
            }
            matched_4 = (max_distance & 7) + 1;
            while (matched_4 = matched_4 - 1, matched_4 != 0) {
              if (ringbuffer[limit2_4 + uVar13] != (uint8_t)*local_6a8) {
                local_698 = limit2_4;
                goto LAB_00117953;
              }
              local_6a8 = (ulong *)((long)local_6a8 + 1);
              limit2_4 = limit2_4 + 1;
            }
            local_698 = limit2_4;
LAB_00117953:
            if (3 < local_698) {
              iVar6 = 0x1f;
              if ((uint)puVar14 != 0) {
                for (; (uint)puVar14 >> iVar6 == 0; iVar6 = iVar6 + -1) {
                }
              }
              uVar13 = (local_698 * 0x21c + 0x1e00) - (ulong)(uint)(iVar6 * 0x78);
              if (best_len_1 < uVar13) {
                i_2 = local_698;
                distance_code = local_698;
                bVar2 = true;
                sr2.len_x_code = (size_t)puVar14;
                sr2.distance = uVar13;
                best_len_1 = uVar13;
              }
            }
          }
        }
        hasher->buckets_[(ulong)(uVar5 << 8) + (long)(int)(hasher->num_[uVar5] & 0xff)] =
             (uint32_t)puVar12;
        hasher->num_[uVar5] = hasher->num_[uVar5] + 1;
        if (!bVar2) {
          pDVar17 = &hasher->dict_search_stats_;
          piVar16 = (int *)(ringbuffer + uVar11);
          bVar2 = false;
          if ((hasher->dict_search_stats_).num_matches < pDVar17->num_lookups >> 7) {
            bVar2 = false;
          }
          else {
            i_3 = (size_t)(((uint)(*piVar16 * 0x1e35a7bd) >> 0x12) << 1);
            for (uStack_620 = 0; uStack_620 < 2; uStack_620 = uStack_620 + 1) {
              uVar1 = kStaticDictionaryHash[i_3];
              uVar11 = (ulong)uVar1;
              pDVar17->num_lookups = pDVar17->num_lookups + 1;
              if (uVar11 != 0) {
                uVar13 = uVar11 & 0x1f;
                uVar15 = (ulong)(uVar1 >> 5);
                if (max_distance < uVar13) {
                  bVar3 = false;
                }
                else {
                  local_4b0 = (ulong *)(&kBrotliDictionary +
                                       (ulong)*(uint *)(&kBrotliDictionaryOffsetsByLength +
                                                       uVar13 * 4) + uVar13 * uVar15);
                  limit2_5 = 0;
                  x_5 = (uVar13 >> 3) + 1;
LAB_00117ce2:
                  x_5 = x_5 - 1;
                  if (x_5 != 0) {
                    if (*local_4b0 == *(ulong *)((long)piVar16 + limit2_5)) goto LAB_00117d60;
                    iVar6 = 0;
                    for (uVar11 = *local_4b0 ^ *(ulong *)((long)piVar16 + limit2_5);
                        (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
                      iVar6 = iVar6 + 1;
                    }
                    local_4a0 = ((ulong)(long)iVar6 >> 3) + limit2_5;
                    goto LAB_00117ebd;
                  }
                  matched_5 = (uVar11 & 7) + 1;
                  while (matched_5 = matched_5 - 1, matched_5 != 0) {
                    if (*(char *)((long)piVar16 + limit2_5) != (char)*local_4b0) {
                      local_4a0 = limit2_5;
                      goto LAB_00117ebd;
                    }
                    local_4b0 = (ulong *)((long)local_4b0 + 1);
                    limit2_5 = limit2_5 + 1;
                  }
                  local_4a0 = limit2_5;
LAB_00117ebd:
                  if ((uVar13 < local_4a0 + 10) && (local_4a0 != 0)) {
                    iVar6 = 0x1f;
                    uVar7 = (uint)(local_ab0 +
                                  ((ulong)""[uVar13 - local_4a0] <<
                                  ((&kBrotliDictionarySizeBitsByLength)[uVar13] & 0x3f)) +
                                  uVar15 + 1);
                    if (uVar7 != 0) {
                      for (; uVar7 >> iVar6 == 0; iVar6 = iVar6 + -1) {
                      }
                    }
                    uVar11 = (local_4a0 * 0x21c + 0x1e00) - (ulong)(uint)(iVar6 * 0x78);
                    if (uVar11 < sr2.distance) {
                      bVar3 = false;
                    }
                    else {
                      distance_code = local_4a0;
                      sr2.len = uVar13 ^ local_4a0;
                      bVar3 = true;
                      sr2.len_x_code =
                           (size_t)(local_ab0 +
                                   ((ulong)""[uVar13 - local_4a0] <<
                                   ((&kBrotliDictionarySizeBitsByLength)[uVar13] & 0x3f)) +
                                   uVar15 + 1);
                      sr2.distance = uVar11;
                    }
                  }
                  else {
                    bVar3 = false;
                  }
                }
                if (bVar3) {
                  (hasher->dict_search_stats_).num_matches =
                       (hasher->dict_search_stats_).num_matches + 1;
                  bVar2 = true;
                }
              }
              i_3 = i_3 + 1;
            }
          }
        }
        puVar12 = ringbuffer_local;
        if ((!bVar2) || (sr2.distance < sr.distance + 700)) goto LAB_0011814d;
        puVar12 = ringbuffer_local + 1;
        pos_end = pos_end + 1;
        sStack_a20 = distance_code;
        sr.len = sr2.len;
        sr.len_x_code = sr2.len_x_code;
        sr.distance = sr2.distance;
        cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
        if ((3 < cost_diff_lazy._4_4_) ||
           (puVar14 = ringbuffer_local + 5, ringbuffer_local = puVar12, puVar9 <= puVar14))
        goto LAB_0011814d;
      } while( true );
    }
    pos_end = pos_end + 1;
    puVar12 = ringbuffer_local + 1;
    if (kMinScore < puVar12) {
      if ((uint8_t *)(kMinScore + lVar10 * 4) < puVar12) {
        puVar14 = ringbuffer_local + 0x11;
        local_b00 = puVar9 + -4;
        ringbuffer_local = puVar12;
        if (puVar14 < local_b00) {
          local_b00 = puVar14;
        }
        for (; puVar12 = ringbuffer_local, ringbuffer_local < local_b00;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar5 = HashBytesH9(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          hasher->buckets_[(long)(int)(hasher->num_[uVar5] & 0xff) + (ulong)(uVar5 << 8)] =
               (uint32_t)ringbuffer_local;
          hasher->num_[uVar5] = hasher->num_[uVar5] + 1;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar14 = ringbuffer_local + 9;
        local_b10 = puVar9 + -3;
        ringbuffer_local = puVar12;
        if (puVar14 < local_b10) {
          local_b10 = puVar14;
        }
        for (; puVar12 = ringbuffer_local, ringbuffer_local < local_b10;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar5 = HashBytesH9(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask));
          hasher->buckets_[(long)(int)(hasher->num_[uVar5] & 0xff) + (ulong)(uVar5 << 8)] =
               (uint32_t)ringbuffer_local;
          hasher->num_[uVar5] = hasher->num_[uVar5] + 1;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
LAB_001161e0:
  local_300 = local_300 + 1;
  limit2 = limit2 + 8;
  goto LAB_00116162;
LAB_001166a1:
  local_340 = local_340 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_00116623;
LAB_00116c0b:
  local_148 = local_148 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00116b8d;
LAB_00117335:
  local_668 = local_668 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_001172b7;
LAB_001177f6:
  local_6a8 = local_6a8 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_00117778;
LAB_00117d60:
  local_4b0 = local_4b0 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_00117ce2;
LAB_0011814d:
  ringbuffer_local = puVar12;
  kMinScore = (size_t)(ringbuffer_local + lVar10 + sStack_a20 * 2);
  local_ac0 = puVar8;
  if (ringbuffer_local < puVar8) {
    local_ac0 = ringbuffer_local;
  }
  if (sr.len_x_code <= local_ac0) {
    uVar11 = (sr.len_x_code + 3) - (long)*dist_cache;
    uVar13 = (sr.len_x_code + 3) - (long)dist_cache[1];
    if (sr.len_x_code == (long)*dist_cache) {
      local_8d8 = 0;
      goto LAB_0011836c;
    }
    if (sr.len_x_code == (long)dist_cache[1]) {
      local_8d8 = 1;
      goto LAB_0011836c;
    }
    if (uVar11 < 7) {
      local_8d8 = (ulong)(int)(0x9750468 >> ((byte)((uVar11 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_0011836c;
    }
    if (uVar13 < 7) {
      local_8d8 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar13 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_0011836c;
    }
    if (sr.len_x_code == (long)dist_cache[2]) {
      local_8d8 = 2;
      goto LAB_0011836c;
    }
    if (sr.len_x_code == (long)dist_cache[3]) {
      local_8d8 = 3;
      goto LAB_0011836c;
    }
  }
  local_8d8 = sr.len_x_code + 0xf;
LAB_0011836c:
  if ((sr.len_x_code <= local_ac0) && (local_8d8 != 0)) {
    dist_cache[3] = dist_cache[2];
    dist_cache[2] = dist_cache[1];
    dist_cache[1] = *dist_cache;
    *dist_cache = (int)sr.len_x_code;
  }
  uVar11 = sStack_a20 ^ sr.len;
  uVar5 = (uint32_t)pos_end;
  commands->insert_len_ = uVar5;
  commands->copy_len_ = (uint)sStack_a20 | (uint)(sr.len << 0x18);
  if (local_8d8 < 0x10) {
    commands->dist_prefix_ = (uint16_t)local_8d8;
    commands->dist_extra_ = 0;
  }
  else {
    iVar6 = 0x1f;
    uVar7 = (uint)(local_8d8 - 0xc);
    if (uVar7 != 0) {
      for (; uVar7 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    iVar6 = iVar6 + -1;
    uVar13 = local_8d8 - 0xc >> ((byte)iVar6 & 0x3f) & 1;
    commands->dist_prefix_ = ((short)iVar6 + -1) * 2 + (short)uVar13 + 0x10;
    commands->dist_extra_ = iVar6 * 0x1000000 | uVar7 - (int)(uVar13 + 2 << ((byte)iVar6 & 0x3f));
  }
  if (pos_end < 6) {
    local_7e2 = (ushort)pos_end;
  }
  else if (pos_end < 0x82) {
    iVar6 = 0x1f;
    if (uVar5 - 2 != 0) {
      for (; uVar5 - 2 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    local_7e2 = (short)(iVar6 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar6 + -1) & 0x3f)) + 2;
  }
  else if (pos_end < 0x842) {
    iVar6 = 0x1f;
    if (uVar5 - 0x42 != 0) {
      for (; uVar5 - 0x42 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    local_7e2 = (short)iVar6 + 10;
  }
  else if (pos_end < 0x1842) {
    local_7e2 = 0x15;
  }
  else if (pos_end < 0x5842) {
    local_7e2 = 0x16;
  }
  else {
    local_7e2 = 0x17;
  }
  if (uVar11 < 10) {
    local_7ba = (short)uVar11 - 2;
  }
  else if (uVar11 < 0x86) {
    uVar7 = (int)uVar11 - 6;
    iVar6 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    local_7ba = (short)(iVar6 + -1) * 2 + (short)(uVar11 - 6 >> ((byte)(iVar6 + -1) & 0x3f)) + 4;
  }
  else if (uVar11 < 0x846) {
    uVar7 = (int)uVar11 - 0x46;
    iVar6 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar6 == 0; iVar6 = iVar6 + -1) {
      }
    }
    local_7ba = (short)iVar6 + 0xc;
  }
  else {
    local_7ba = 0x17;
  }
  local_79a = local_7ba & 7 | (local_7e2 & 7) << 3;
  if (((commands->dist_prefix_ == 0) && (local_7e2 < 8)) && (local_7ba < 0x10)) {
    if (7 < local_7ba) {
      local_79a = local_79a | 0x40;
    }
  }
  else {
    local_79a = *(ushort *)
                 (CombineLengthCodes_cells +
                 (long)(((int)(uint)local_7ba >> 3) + ((int)(uint)local_7e2 >> 3) * 3) * 2) |
                local_79a;
  }
  commands->cmd_prefix_ = local_79a;
  *num_literals = pos_end + *num_literals;
  pos_end = 0;
  local_c8 = ringbuffer_local + 2;
  local_af0 = ringbuffer_local + sStack_a20;
  if (local_a88 <= local_af0) {
    local_af0 = local_a88;
  }
  for (; local_c8 < local_af0; local_c8 = local_c8 + 1) {
    uVar5 = HashBytesH9(ringbuffer + ((ulong)local_c8 & ringbuffer_mask));
    hasher->buckets_[(long)(int)(hasher->num_[uVar5] & 0xff) + (ulong)(uVar5 << 8)] =
         (uint32_t)local_c8;
    hasher->num_[uVar5] = hasher->num_[uVar5] + 1;
  }
  commands = commands + 1;
  puVar12 = ringbuffer_local + sStack_a20;
  goto LAB_00115e6c;
}

Assistant:

static BROTLI_NOINLINE void FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, Hasher* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 400;

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_x_code = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    if (FN(FindLongestMatch)(hasher, ringbuffer, ringbuffer_mask, dist_cache,
                             position, max_length, max_distance, &sr)) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 700;
        BROTLI_BOOL is_match_found;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_x_code = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        is_match_found = FN(FindLongestMatch)(hasher, ringbuffer,
            ringbuffer_mask, dist_cache, position + 1, max_length, max_distance,
            &sr2);
        if (is_match_found && sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance, dist_cache);
        if (sr.distance <= max_distance && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
        }
        InitCommand(commands++, insert_length, sr.len, sr.len ^ sr.len_x_code,
            distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them. */
      FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, position + 2,
                     BROTLI_MIN(size_t, position + sr.len, store_end));
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}